

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O0

QString * __thiscall QLocale::toString(QLocale *this,QDate date,FormatType format)

{
  bool bVar1;
  QLocalePrivate *pQVar2;
  int in_ECX;
  undefined8 in_RSI;
  QDate in_RDI;
  long in_FS_OFFSET;
  QString format_str;
  QVariant res;
  QVariant *in_stack_ffffffffffffff08;
  QVariant *in_stack_ffffffffffffff10;
  QDate in_stack_ffffffffffffff18;
  undefined7 in_stack_ffffffffffffff20;
  undefined1 in_stack_ffffffffffffff27;
  QSystemLocale *in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff30;
  uint in_stack_ffffffffffffff34;
  FormatType format_00;
  undefined4 in_stack_ffffffffffffff58;
  uint uVar3;
  undefined4 in_stack_ffffffffffffff5c;
  undefined1 local_48 [32];
  undefined1 *local_28;
  undefined1 *puStack_20;
  undefined1 *local_18;
  undefined1 *puStack_10;
  long local_8;
  
  format_00 = (FormatType)((ulong)in_RSI >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = QDate::isValid((QDate *)CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20));
  if (bVar1) {
    pQVar2 = QSharedDataPointer<QLocalePrivate>::operator->
                       ((QSharedDataPointer<QLocalePrivate> *)0x4ce153);
    if (pQVar2->m_data == &systemLocaleData) {
      local_18 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_10 = &DAT_aaaaaaaaaaaaaaaa;
      local_28 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_20 = &DAT_aaaaaaaaaaaaaaaa;
      in_stack_ffffffffffffff28 = systemLocale();
      in_stack_ffffffffffffff34 = 0x12 - (in_ECX == 0);
      ::QVariant::QVariant(in_stack_ffffffffffffff10,in_stack_ffffffffffffff18);
      (*in_stack_ffffffffffffff28->_vptr_QSystemLocale[2])
                (&local_28,in_stack_ffffffffffffff28,(ulong)in_stack_ffffffffffffff34,local_48);
      ::QVariant::~QVariant(in_stack_ffffffffffffff10);
      bVar1 = ::QVariant::isNull((QVariant *)in_stack_ffffffffffffff18.jd);
      if (!bVar1) {
        ::QVariant::toString(in_stack_ffffffffffffff08);
      }
      uVar3 = (uint)!bVar1;
      ::QVariant::~QVariant(in_stack_ffffffffffffff10);
      if (uVar3 != 0) goto LAB_004ce33b;
      in_stack_ffffffffffffff58 = 0;
    }
    dateFormat((QLocale *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),format_00);
    toString((QLocale *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),in_RDI,
             (QString *)in_stack_ffffffffffffff28);
    QString::~QString((QString *)0x4ce318);
  }
  else {
    QString::QString((QString *)0x4ce144);
  }
LAB_004ce33b:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (QString *)in_RDI.jd;
}

Assistant:

QString QLocale::toString(QDate date, FormatType format) const
{
    if (!date.isValid())
        return QString();

#ifndef QT_NO_SYSTEMLOCALE
    if (d->m_data == &systemLocaleData) {
        QVariant res = systemLocale()->query(format == LongFormat
                                             ? QSystemLocale::DateToStringLong
                                             : QSystemLocale::DateToStringShort,
                                             date);
        if (!res.isNull())
            return res.toString();
    }
#endif

    QString format_str = dateFormat(format);
    return toString(date, format_str);
}